

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# numparse_impl.cpp
# Opt level: O2

NumberParserImpl *
icu_63::numparse::impl::NumberParserImpl::createSimpleParser
          (Locale *locale,UnicodeString *patternString,parse_flags_t parseFlags,UErrorCode *status)

{
  anon_struct_3968_13_3a90479f_for_fLocalMatchers *this;
  AffixTokenMatcherWarehouse *this_00;
  AffixMatcherWarehouse *this_01;
  PercentMatcher *this_02;
  PermilleMatcher *this_03;
  NanMatcher *this_04;
  InfinityMatcher *this_05;
  PaddingMatcher *this_06;
  NumberParserImpl *this_07;
  DecimalMatcher *pDVar1;
  MinusSignMatcher *pMVar2;
  PlusSignMatcher *pPVar3;
  ScientificMatcher *pSVar4;
  CombinedCurrencyMatcher *pCVar5;
  ConstChar16Ptr local_1e48;
  char16_t *local_1e40;
  Grouper local_1e30;
  CurrencyUnit local_1e20;
  UnicodeString local_1e00;
  AffixTokenMatcherWarehouse local_1dc0;
  AffixTokenMatcherSetupData affixSetupData;
  CurrencySymbols currencySymbols;
  ParsedPatternInfo patternInfo;
  DecimalFormatSymbols symbols;
  DecimalFormatSymbols dfs;
  
  this_07 = (NumberParserImpl *)UMemory::operator_new((UMemory *)0x1040,(size_t)patternString);
  if (this_07 != (NumberParserImpl *)0x0) {
    NumberParserImpl(this_07,parseFlags);
  }
  DecimalFormatSymbols::DecimalFormatSymbols(&symbols,locale,status);
  IgnorablesMatcher::IgnorablesMatcher((IgnorablesMatcher *)&dfs,DEFAULT_IGNORABLES);
  this = &this_07->fLocalMatchers;
  SymbolMatcher::operator=((SymbolMatcher *)this,(SymbolMatcher *)&dfs);
  SymbolMatcher::~SymbolMatcher((SymbolMatcher *)&dfs);
  DecimalFormatSymbols::DecimalFormatSymbols(&dfs,locale,status);
  UnicodeString::UnicodeString((UnicodeString *)&local_1dc0,L"IU$");
  DecimalFormatSymbols::setSymbol(&dfs,kCurrencySymbol,(UnicodeString *)&local_1dc0,'\x01');
  UnicodeString::~UnicodeString((UnicodeString *)&local_1dc0);
  UnicodeString::UnicodeString((UnicodeString *)&local_1dc0,L"ICU");
  DecimalFormatSymbols::setSymbol(&dfs,kIntlCurrencySymbol,(UnicodeString *)&local_1dc0,'\x01');
  UnicodeString::~UnicodeString((UnicodeString *)&local_1dc0);
  local_1e48.p_ = L"ICU";
  CurrencyUnit::CurrencyUnit(&local_1e20,&local_1e48,status);
  icu_63::number::impl::CurrencySymbols::CurrencySymbols
            (&currencySymbols,&local_1e20,locale,&dfs,status);
  CurrencyUnit::~CurrencyUnit(&local_1e20);
  local_1e40 = local_1e48.p_;
  icu_63::number::impl::ParsedPatternInfo::ParsedPatternInfo(&patternInfo);
  icu_63::number::impl::PatternParser::parseToPatternInfo(patternString,&patternInfo,status);
  affixSetupData.dfs = &symbols;
  affixSetupData.currencySymbols = &currencySymbols;
  affixSetupData.ignorables = &this->ignorables;
  affixSetupData.locale = locale;
  affixSetupData.parseFlags = parseFlags;
  AffixTokenMatcherWarehouse::AffixTokenMatcherWarehouse(&local_1dc0,&affixSetupData);
  this_00 = &(this_07->fLocalMatchers).affixTokenMatcherWarehouse;
  AffixTokenMatcherWarehouse::operator=(this_00,&local_1dc0);
  AffixTokenMatcherWarehouse::~AffixTokenMatcherWarehouse(&local_1dc0);
  AffixMatcherWarehouse::AffixMatcherWarehouse((AffixMatcherWarehouse *)&local_1dc0,this_00);
  this_01 = &(this_07->fLocalMatchers).affixMatcherWarehouse;
  AffixMatcherWarehouse::operator=(this_01,(AffixMatcherWarehouse *)&local_1dc0);
  AffixMatcherWarehouse::~AffixMatcherWarehouse((AffixMatcherWarehouse *)&local_1dc0);
  AffixMatcherWarehouse::createAffixMatchers
            (this_01,&patternInfo.super_AffixPatternProvider,(MutableMatcherCollection *)this_07,
             &this->ignorables,parseFlags,status);
  local_1e30 = icu_63::number::impl::Grouper::forStrategy(UNUM_GROUPING_AUTO);
  icu_63::number::impl::Grouper::setLocaleData(&local_1e30,&patternInfo,locale);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this);
  DecimalMatcher::DecimalMatcher((DecimalMatcher *)&local_1dc0,&symbols,&local_1e30,parseFlags);
  pDVar1 = DecimalMatcher::operator=
                     (&(this_07->fLocalMatchers).decimal,(DecimalMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,pDVar1);
  DecimalMatcher::~DecimalMatcher((DecimalMatcher *)&local_1dc0);
  MinusSignMatcher::MinusSignMatcher((MinusSignMatcher *)&local_1dc0,&symbols,false);
  pMVar2 = MinusSignMatcher::operator=
                     (&(this_07->fLocalMatchers).minusSign,(MinusSignMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,pMVar2);
  SymbolMatcher::~SymbolMatcher((SymbolMatcher *)&local_1dc0);
  PlusSignMatcher::PlusSignMatcher((PlusSignMatcher *)&local_1dc0,&symbols,false);
  pPVar3 = PlusSignMatcher::operator=
                     (&(this_07->fLocalMatchers).plusSign,(PlusSignMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,pPVar3);
  SymbolMatcher::~SymbolMatcher((SymbolMatcher *)&local_1dc0);
  PercentMatcher::PercentMatcher((PercentMatcher *)&local_1dc0,&symbols);
  this_02 = &(this_07->fLocalMatchers).percent;
  SymbolMatcher::operator=(&this_02->super_SymbolMatcher,(SymbolMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this_02);
  SymbolMatcher::~SymbolMatcher((SymbolMatcher *)&local_1dc0);
  PermilleMatcher::PermilleMatcher((PermilleMatcher *)&local_1dc0,&symbols);
  this_03 = &(this_07->fLocalMatchers).permille;
  SymbolMatcher::operator=(&this_03->super_SymbolMatcher,(SymbolMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this_03);
  SymbolMatcher::~SymbolMatcher((SymbolMatcher *)&local_1dc0);
  NanMatcher::NanMatcher((NanMatcher *)&local_1dc0,&symbols);
  this_04 = &(this_07->fLocalMatchers).nan;
  SymbolMatcher::operator=(&this_04->super_SymbolMatcher,(SymbolMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this_04);
  SymbolMatcher::~SymbolMatcher((SymbolMatcher *)&local_1dc0);
  InfinityMatcher::InfinityMatcher((InfinityMatcher *)&local_1dc0,&symbols);
  this_05 = &(this_07->fLocalMatchers).infinity;
  SymbolMatcher::operator=(&this_05->super_SymbolMatcher,(SymbolMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this_05);
  SymbolMatcher::~SymbolMatcher((SymbolMatcher *)&local_1dc0);
  UnicodeString::UnicodeString(&local_1e00,L"@");
  PaddingMatcher::PaddingMatcher((PaddingMatcher *)&local_1dc0,&local_1e00);
  this_06 = &(this_07->fLocalMatchers).padding;
  SymbolMatcher::operator=(&this_06->super_SymbolMatcher,(SymbolMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,this_06);
  SymbolMatcher::~SymbolMatcher((SymbolMatcher *)&local_1dc0);
  UnicodeString::~UnicodeString(&local_1e00);
  ScientificMatcher::ScientificMatcher((ScientificMatcher *)&local_1dc0,&symbols,&local_1e30);
  pSVar4 = ScientificMatcher::operator=
                     (&(this_07->fLocalMatchers).scientific,(ScientificMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,pSVar4);
  ScientificMatcher::~ScientificMatcher((ScientificMatcher *)&local_1dc0);
  CombinedCurrencyMatcher::CombinedCurrencyMatcher
            ((CombinedCurrencyMatcher *)&local_1dc0,&currencySymbols,&symbols,parseFlags,status);
  pCVar5 = CombinedCurrencyMatcher::operator=
                     (&(this_07->fLocalMatchers).currency,(CombinedCurrencyMatcher *)&local_1dc0);
  (*(this_07->super_MutableMatcherCollection)._vptr_MutableMatcherCollection[2])(this_07,pCVar5);
  CombinedCurrencyMatcher::~CombinedCurrencyMatcher((CombinedCurrencyMatcher *)&local_1dc0);
  this_07->fFrozen = true;
  icu_63::number::impl::ParsedPatternInfo::~ParsedPatternInfo(&patternInfo);
  icu_63::number::impl::CurrencySymbols::~CurrencySymbols(&currencySymbols);
  DecimalFormatSymbols::~DecimalFormatSymbols(&dfs);
  DecimalFormatSymbols::~DecimalFormatSymbols(&symbols);
  return this_07;
}

Assistant:

NumberParserImpl*
NumberParserImpl::createSimpleParser(const Locale& locale, const UnicodeString& patternString,
                                     parse_flags_t parseFlags, UErrorCode& status) {

    LocalPointer<NumberParserImpl> parser(new NumberParserImpl(parseFlags));
    DecimalFormatSymbols symbols(locale, status);

    parser->fLocalMatchers.ignorables = {unisets::DEFAULT_IGNORABLES};
    IgnorablesMatcher& ignorables = parser->fLocalMatchers.ignorables;

    DecimalFormatSymbols dfs(locale, status);
    dfs.setSymbol(DecimalFormatSymbols::kCurrencySymbol, u"IU$");
    dfs.setSymbol(DecimalFormatSymbols::kIntlCurrencySymbol, u"ICU");
    CurrencySymbols currencySymbols({u"ICU", status}, locale, dfs, status);

    ParsedPatternInfo patternInfo;
    PatternParser::parseToPatternInfo(patternString, patternInfo, status);

    // The following statements set up the affix matchers.
    AffixTokenMatcherSetupData affixSetupData = {
            currencySymbols, symbols, ignorables, locale, parseFlags};
    parser->fLocalMatchers.affixTokenMatcherWarehouse = {&affixSetupData};
    parser->fLocalMatchers.affixMatcherWarehouse = {&parser->fLocalMatchers.affixTokenMatcherWarehouse};
    parser->fLocalMatchers.affixMatcherWarehouse.createAffixMatchers(
            patternInfo, *parser, ignorables, parseFlags, status);

    Grouper grouper = Grouper::forStrategy(UNUM_GROUPING_AUTO);
    grouper.setLocaleData(patternInfo, locale);

    parser->addMatcher(parser->fLocalMatchers.ignorables);
    parser->addMatcher(parser->fLocalMatchers.decimal = {symbols, grouper, parseFlags});
    parser->addMatcher(parser->fLocalMatchers.minusSign = {symbols, false});
    parser->addMatcher(parser->fLocalMatchers.plusSign = {symbols, false});
    parser->addMatcher(parser->fLocalMatchers.percent = {symbols});
    parser->addMatcher(parser->fLocalMatchers.permille = {symbols});
    parser->addMatcher(parser->fLocalMatchers.nan = {symbols});
    parser->addMatcher(parser->fLocalMatchers.infinity = {symbols});
    parser->addMatcher(parser->fLocalMatchers.padding = {u"@"});
    parser->addMatcher(parser->fLocalMatchers.scientific = {symbols, grouper});
    parser->addMatcher(parser->fLocalMatchers.currency = {currencySymbols, symbols, parseFlags, status});
//    parser.addMatcher(new RequireNumberMatcher());

    parser->freeze();
    return parser.orphan();
}